

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void convolve(int *c1,int *c2,int param_3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  float in_stack_000004f8;
  int in_stack_000004fc;
  float in_stack_000009f0;
  int in_stack_000009f4;
  int h2;
  int h1;
  int l;
  int k;
  int j;
  int i;
  float s;
  image512_t *t;
  int n_local;
  qnode_ptr_t c2_local;
  qnode_ptr_t c1_local;
  
  iVar2 = in_stack_000009f4 / 2;
  for (h1 = iVar2; h1 < param_3 - iVar2; h1 = h1 + 1) {
    for (k = 0; k < c1[2]; k = k + 1) {
      for (l = 0; l < c1[1]; l = l + 1) {
        j = 0;
        for (h2 = 0; h2 < in_stack_000009f4; h2 = h2 + 1) {
          j = (int)(*(float *)(*(long *)(c1 + (long)((h2 + h1) - iVar2) * 2 + 6) +
                              (long)(*c1 * k + l) * 4) * *(float *)(&stack0x00000500 + (long)h2 * 4)
                   + (float)j);
        }
        *(float *)(*(long *)(c2 + (long)(h1 - iVar2) * 2 + 6) + (long)(*c2 * k + l) * 4) =
             (float)j / in_stack_000009f0;
      }
    }
  }
  iVar3 = in_stack_000004fc / 2;
  for (h1 = iVar2; h1 < param_3 - iVar2; h1 = h1 + 1) {
    __ptr = malloc(0x61840);
    for (k = 0; l = iVar3, iVar1 = iVar3, k < c2[2]; k = k + 1) {
      for (; l < c2[1] - iVar3; l = l + 1) {
        j = 0;
        for (h2 = 0; h2 < in_stack_000004fc; h2 = h2 + 1) {
          j = (int)(*(float *)(*(long *)(c2 + (long)(h1 - iVar2) * 2 + 6) +
                              (long)((*c2 * k + l + h2) - iVar3) * 4) *
                    *(float *)(&stack0x00000008 + (long)h2 * 4) + (float)j);
        }
        *(float *)((long)__ptr + (long)(*c2 * k + l) * 4) = (float)j / in_stack_000004f8;
      }
    }
    while (k = iVar1, k < c2[2] - iVar3) {
      for (l = 0; l < c2[1]; l = l + 1) {
        j = 0;
        for (h2 = 0; h2 < in_stack_000004fc; h2 = h2 + 1) {
          j = (int)(*(float *)((long)__ptr + (long)(*c2 * ((k + h2) - iVar3) + l) * 4) *
                    *(float *)(&stack0x00000008 + (long)h2 * 4) + (float)j);
        }
        *(float *)(*(long *)(c2 + (long)(h1 - iVar2) * 2 + 6) + (long)(*c2 * k + l) * 4) =
             (float)j / in_stack_000004f8;
      }
      iVar1 = k + 1;
    }
    free(__ptr);
  }
  c2[4] = iVar3 + c2[4];
  return;
}

Assistant:

void convolve(c1,c2,ker1,ker2,n)
qnode_ptr_t c1, c2 ;
kernel_t ker1, ker2 ;
int n ;

{ image512_t *t ;
  float s ;
  int i, j, k, l, h1, h2 ;

  h2 = ker2.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {
    for (i = 0 ; i < c1->sizy ; i++) {
      for (j = 0 ; j < c1->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker2.m ; l++) {
          s += (*c1->gauss_ptr[l+k-h2])[c1->res*i + j]*ker2.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker2.f ;
      }
    }
  }

  h1 = ker1.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {

    t = (image512_t *)malloc(sizeof(image512_t)) ;

    for (i = 0 ; i < c2->sizy ; i++) {
      for (j = h1 ; j < c2->sizx - h1 ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*c2->gauss_ptr[k-h2])[c2->res*i + j+l-h1]*ker1.k[l] ;
        }
        (*t)[c2->res*i + j] = s/ker1.f ;
      }
    }

    for (i = h1 ; i < c2->sizy - h1 ; i++) {
      for (j = 0 ; j < c2->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*t)[c2->res*(i+l-h1) + j]*ker1.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker1.f ;
      }
    }
    free((image512_t *)t) ;
  }
  c2->ofst += h1 ;
}